

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  MemPage *pMVar1;
  MemPage *pMVar2;
  u8 eType_00;
  Pgno PVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int unaff_R13D;
  long in_FS_OFFSET;
  bool bVar9;
  Pgno iFreePg;
  Pgno iFreePg_1;
  MemPage *pFreePg;
  Pgno iPtrPage;
  u8 eType;
  MemPage *local_58;
  Pgno local_4c;
  MemPage *local_48;
  Pgno local_40;
  u8 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PVar3 = 0;
  if (1 < iLastPg) {
    iVar7 = (iLastPg - 2) - (iLastPg - 2) % (pBt->usableSize / 5 + 1);
    PVar3 = iVar7 + (uint)(iVar7 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  if ((PVar3 != iLastPg) && ((uint)sqlite3PendingByte / pBt->pageSize + 1 != iLastPg)) {
    local_39 = 0xaa;
    local_40 = 0xaaaaaaaa;
    uVar4 = *(uint *)(pBt->pPage1->aData + 0x24);
    if (((uVar4 >> 0x18 == 0 && (uVar4 & 0xff0000) == 0) && (uVar4 & 0xff00) == 0) &&
        (uVar4 & 0xff) == 0) {
      iVar7 = 0x65;
LAB_0014021f:
      bVar9 = false;
    }
    else {
      iVar7 = ptrmapGet(pBt,iLastPg,&local_39,&local_40);
      eType_00 = local_39;
      if (iVar7 != 0) goto LAB_0014021f;
      if (local_39 == '\x02') {
        bVar9 = true;
        iVar7 = unaff_R13D;
        if (bCommit == 0) {
          local_58 = (MemPage *)CONCAT44(local_58._4_4_,0xaaaaaaaa);
          local_48 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          iVar7 = allocateBtreePage(pBt,&local_48,(Pgno *)&local_58,iLastPg,'\x01');
          if (iVar7 != 0) goto LAB_0014021f;
          if (local_48 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_48->pDbPage);
          }
        }
      }
      else if (local_39 == '\x01') {
        bVar9 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1242a,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        iVar7 = 0xb;
      }
      else {
        local_4c = 0xaaaaaaaa;
        local_48 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        bVar9 = false;
        iVar7 = btreeGetPage(pBt,iLastPg,&local_48,0);
        pMVar1 = local_48;
        if (iVar7 == 0) {
          PVar3 = 0;
          if (bCommit == 0) {
            PVar3 = nFin;
          }
          iVar7 = unaff_R13D;
          do {
            local_58 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
            uVar4 = pBt->nPage;
            iVar6 = allocateBtreePage(pBt,&local_58,&local_4c,PVar3,(bCommit == 0) * '\x02');
            if (iVar6 == 0) {
              if (local_58 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_58->pDbPage);
              }
              bVar9 = true;
              if (uVar4 < local_4c) {
                if (pMVar1 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar1->pDbPage);
                }
                bVar9 = false;
                iVar7 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1245e,
                            "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
              }
            }
            else {
              if (pMVar1 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar1->pDbPage);
              }
              bVar9 = false;
              iVar7 = iVar6;
            }
            pMVar2 = local_48;
            if (!bVar9) goto LAB_0014021f;
          } while ((bCommit != 0) && (nFin < local_4c));
          iVar6 = relocatePage(pBt,local_48,eType_00,local_40,local_4c,bCommit);
          if (pMVar2 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar2->pDbPage);
          }
          bVar9 = iVar6 == 0;
          if (!bVar9) {
            iVar7 = iVar6;
          }
        }
      }
    }
    if (!bVar9) goto LAB_00140299;
  }
  iVar7 = 0;
  if (bCommit == 0) {
    uVar4 = (uint)sqlite3PendingByte / pBt->pageSize;
    uVar8 = iLastPg - 1;
    do {
      if ((-2 - uVar4) + uVar8 != -1) {
        uVar5 = 0;
        if (1 < uVar8) {
          iVar7 = (uVar8 - 2) - (uVar8 - 2) % (pBt->usableSize / 5 + 1);
          uVar5 = iVar7 + (uint)(iVar7 + 1U == uVar4) + 2;
        }
        if (uVar8 != uVar5) goto code_r0x0014028d;
      }
      uVar8 = uVar8 - 1;
    } while( true );
  }
LAB_00140299:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
code_r0x0014028d:
  pBt->bDoTruncate = '\x01';
  pBt->nPage = uVar8;
  iVar7 = 0;
  goto LAB_00140299;
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        Pgno dbSize = btreePagecount(pBt);
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
        if( iFreePg>dbSize ){
          releasePage(pLastPg);
          return SQLITE_CORRUPT_BKPT;
        }
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );

      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}